

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal_thread.cpp
# Opt level: O0

BOOL SetThreadPriority(HANDLE hThread,int nPriority)

{
  PAL_ERROR dwLastError;
  CPalThread *pThread_00;
  PAL_ERROR palError;
  CPalThread *pThread;
  int nPriority_local;
  HANDLE hThread_local;
  
  if (!PAL_InitializeChakraCoreCalled) {
    abort();
  }
  pThread_00 = CorUnix::InternalGetCurrentThread();
  dwLastError = CorUnix::InternalSetThreadPriority(pThread_00,hThread,nPriority);
  if (dwLastError != 0) {
    CorUnix::CPalThread::SetLastError(dwLastError);
  }
  if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
    abort();
  }
  return (BOOL)(dwLastError == 0);
}

Assistant:

BOOL
PALAPI
SetThreadPriority(
          IN HANDLE hThread,
          IN int nPriority)
{
    CPalThread *pThread;
    PAL_ERROR palError = NO_ERROR;

    PERF_ENTRY(SetThreadPriority);
    ENTRY("SetThreadPriority(hThread=%p, nPriority=%#x)\n", hThread, nPriority);

    pThread = InternalGetCurrentThread();

    palError = InternalSetThreadPriority(
        pThread,
        hThread,
        nPriority
        );

    if (NO_ERROR != palError)
    {
        pThread->SetLastError(palError);
    }

    LOGEXIT("SetThreadPriority returns BOOL %d\n", NO_ERROR == palError);
    PERF_EXIT(SetThreadPriority);

    return NO_ERROR == palError;
}